

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_globalz_set_table_gej
               (size_t len,secp256k1_ge *r,secp256k1_fe *globalz,secp256k1_gej *a,secp256k1_fe *zr)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  secp256k1_fe *psVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint64_t uVar67;
  uint64_t uVar68;
  uint64_t uVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  secp256k1_fe *psVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  secp256k1_ge *psVar77;
  secp256k1_gej *a_00;
  secp256k1_fe zs;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe local_78;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  lVar70 = len - 1;
  if (len != 0) {
    psVar77 = r + lVar70;
    (psVar77->x).n[4] = a[lVar70].x.n[4];
    uVar67 = a[lVar70].x.n[0];
    uVar68 = a[lVar70].x.n[1];
    puVar1 = a[lVar70].x.n + 2;
    uVar69 = puVar1[1];
    (psVar77->x).n[2] = *puVar1;
    (psVar77->x).n[3] = uVar69;
    (psVar77->x).n[0] = uVar67;
    (psVar77->x).n[1] = uVar68;
    uVar67 = a[lVar70].y.n[1];
    puVar1 = a[lVar70].y.n + 2;
    uVar68 = *puVar1;
    uVar69 = puVar1[1];
    (psVar77->y).n[0] = a[lVar70].y.n[0];
    (psVar77->y).n[1] = uVar67;
    (psVar77->y).n[2] = uVar68;
    (psVar77->y).n[3] = uVar69;
    (psVar77->y).n[4] = a[lVar70].y.n[4];
    secp256k1_fe_normalize_weak(&psVar77->y);
    globalz->n[4] = a[lVar70].z.n[4];
    uVar67 = a[lVar70].z.n[0];
    uVar68 = a[lVar70].z.n[1];
    puVar1 = a[lVar70].z.n + 2;
    uVar69 = puVar1[1];
    globalz->n[2] = *puVar1;
    globalz->n[3] = uVar69;
    globalz->n[0] = uVar67;
    globalz->n[1] = uVar68;
    psVar77->infinity = 0;
    local_78.n[4] = zr[lVar70].n[4];
    local_78.n[0] = zr[lVar70].n[0];
    local_78.n[1] = zr[lVar70].n[1];
    local_78.n[2] = zr[lVar70].n[2];
    local_78.n[3] = (zr[lVar70].n + 2)[1];
    if (lVar70 != 0) {
      a_00 = a + (len - 2);
      psVar77 = r + (len - 2);
      lVar74 = 0;
      psVar58 = zr + len;
      do {
        psVar73 = psVar58 + -1;
        if (lVar74 != 0) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar73->n[0];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_78.n[3];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = psVar58[-1].n[1];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_78.n[2];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = psVar58[-1].n[2];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_78.n[1];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = psVar58[-1].n[3];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_78.n[0];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = psVar58[-1].n[4];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_78.n[4];
          uVar71 = SUB168(auVar6 * auVar36,0);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar71 & 0xfffffffffffff;
          auVar2 = auVar3 * auVar33 + auVar2 * auVar32 + auVar4 * auVar34 + auVar5 * auVar35 +
                   auVar7 * ZEXT816(0x1000003d10);
          uVar72 = auVar2._0_8_;
          local_38 = uVar72 & 0xfffffffffffff;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar72 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = psVar73->n[0];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_78.n[4];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = psVar58[-1].n[1];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_78.n[3];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = psVar58[-1].n[2];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_78.n[2];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = psVar58[-1].n[3];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_78.n[1];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = psVar58[-1].n[4];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_78.n[0];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar71 >> 0x34 | SUB168(auVar6 * auVar36,8) << 0xc;
          auVar2 = auVar8 * auVar37 + auVar59 + auVar9 * auVar38 + auVar10 * auVar39 +
                   auVar11 * auVar40 + auVar12 * auVar41 + auVar13 * ZEXT816(0x1000003d10);
          local_40 = auVar2._0_8_;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_40 >> 0x34 | auVar2._8_8_ << 0xc;
          local_48 = (local_40 & 0xfffffffffffff) >> 0x30;
          local_40 = local_40 & 0xffffffffffff;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = psVar73->n[0];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_78.n[0];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = psVar58[-1].n[1];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_78.n[4];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = psVar58[-1].n[2];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_78.n[3];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = psVar58[-1].n[3];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_78.n[2];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = psVar58[-1].n[4];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = local_78.n[1];
          auVar2 = auVar15 * auVar43 + auVar61 + auVar16 * auVar44 + auVar17 * auVar45 +
                   auVar18 * auVar46;
          uVar71 = auVar2._0_8_;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar71 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = (uVar71 & 0xfffffffffffff) << 4 | local_48;
          uVar72 = auVar60._0_8_;
          auVar60 = auVar14 * auVar42 + ZEXT816(0x1000003d1) * auVar47;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar72 >> 0x34 | auVar60._8_8_ << 0xc;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = psVar73->n[0];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_78.n[1];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = psVar58[-1].n[1];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_78.n[0];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = psVar58[-1].n[2];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_78.n[4];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = psVar58[-1].n[3];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_78.n[3];
          auVar23._8_8_ = 0;
          auVar23._0_8_ = psVar58[-1].n[4];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_78.n[2];
          auVar3 = auVar21 * auVar50 + auVar63 + auVar22 * auVar51 + auVar23 * auVar52;
          uVar71 = auVar3._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar71 & 0xfffffffffffff;
          auVar2 = auVar19 * auVar48 + auVar62 + auVar20 * auVar49 + auVar24 * ZEXT816(0x1000003d10)
          ;
          uVar75 = auVar2._0_8_;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar71 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar75 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = psVar73->n[0];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_78.n[2];
          auVar26._8_8_ = 0;
          auVar26._0_8_ = psVar58[-1].n[1];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_78.n[1];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = psVar58[-1].n[2];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_78.n[0];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = psVar58[-1].n[3];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = local_78.n[4];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = psVar58[-1].n[4];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_78.n[3];
          auVar3 = auVar28 * auVar56 + auVar65 + auVar29 * auVar57;
          uVar71 = auVar3._0_8_;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar71 & 0xfffffffffffff;
          auVar2 = auVar25 * auVar53 + auVar64 + auVar26 * auVar54 + auVar27 * auVar55 +
                   auVar30 * ZEXT816(0x1000003d10);
          uVar76 = auVar2._0_8_;
          local_78.n[2] = uVar76 & 0xfffffffffffff;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = (uVar76 >> 0x34 | auVar2._8_8_ << 0xc) + local_38;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar71 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar66 = auVar31 * ZEXT816(0x1000003d10) + auVar66;
          uVar71 = auVar66._0_8_;
          local_78.n[3] = uVar71 & 0xfffffffffffff;
          local_78.n[4] = (uVar71 >> 0x34 | auVar66._8_8_ << 0xc) + local_40;
          local_78.n[0] = uVar72 & 0xfffffffffffff;
          local_78.n[1] = uVar75 & 0xfffffffffffff;
        }
        secp256k1_ge_set_gej_zinv(psVar77,a_00,&local_78);
        lVar74 = lVar74 + 1;
        a_00 = a_00 + -1;
        psVar77 = psVar77 + -1;
        psVar58 = psVar73;
      } while (lVar70 != lVar74);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_globalz_set_table_gej(size_t len, secp256k1_ge *r, secp256k1_fe *globalz, const secp256k1_gej *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* The z of the final point gives us the "global Z" for the table. */
        r[i].x = a[i].x;
        r[i].y = a[i].y;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&r[i].y);
        *globalz = a[i].z;
        r[i].infinity = 0;
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &zs);
        }
    }
}